

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

int i4_choose(int n,int k)

{
  int iVar1;
  int iVar2;
  undefined4 local_20;
  int value;
  int mx;
  int mn;
  int i;
  int k_local;
  int n_local;
  
  iVar1 = i4_min(k,n - k);
  if (iVar1 < 0) {
    local_20 = 0;
  }
  else if (iVar1 == 0) {
    local_20 = 1;
  }
  else {
    iVar2 = i4_max(k,n - k);
    local_20 = iVar2 + 1;
    for (mx = 2; mx <= iVar1; mx = mx + 1) {
      local_20 = (local_20 * (iVar2 + mx)) / mx;
    }
  }
  return local_20;
}

Assistant:

BURKHARDT_EXPORT
int i4_choose ( int n, int k )

//****************************************************************************80
//
//  Purpose:
//
//    I4_CHOOSE computes the binomial coefficient C(N,K).
//
//  Discussion:
//
//    The value is calculated in such a way as to avoid overflow and
//    roundoff.  The calculation is done in integer arithmetic.
//
//    The formula used is:
//
//      C(N,K) = N! / ( K! * (N-K)! )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    02 June 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    ML Wolfson, HV Wright,
//    Algorithm 160:
//    Combinatorial of M Things Taken N at a Time,
//    Communications of the ACM,
//    Volume 6, Number 4, April 1963, page 161.
//
//  Parameters:
//
//    Input, int N, K, are the values of N and K.
//
//    Output, int I4_CHOOSE, the number of combinations of N
//    things taken K at a time.
//
{
  int i;
  int mn;
  int mx;
  int value;

  mn = i4_min ( k, n - k );

  if ( mn < 0 )
  {
    value = 0;
  }
  else if ( mn == 0 )
  {
    value = 1;
  }
  else
  {
    mx = i4_max ( k, n - k );
    value = mx + 1;

    for ( i = 2; i <= mn; i++ )
    {
      value = ( value * ( mx + i ) ) / i;
    }
  }

  return value;
}